

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

void ImportModule(ExpressionContext *ctx,SynBase *source,ByteCode *bytecode,Lexeme *lexStream,
                 uint lexStreamSize,InplaceStr name)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  undefined4 extraout_var;
  ModuleData **ppMVar5;
  Lexer *this;
  uint uVar6;
  TraceScope traceScope;
  uint local_294;
  TraceScope local_278;
  undefined1 local_268 [8];
  char *pcStack_260;
  ModuleData *local_258 [32];
  Allocator *local_158;
  SmallArray<TypeBase_*,_32U> local_150;
  ModuleData *local_38;
  ModuleData *pMVar4;
  undefined4 extraout_var_00;
  
  if (ImportModule(ExpressionContext&,SynBase*,ByteCode*,Lexeme*,unsigned_int,InplaceStr)::token ==
      '\0') {
    iVar2 = __cxa_guard_acquire(&ImportModule(ExpressionContext&,SynBase*,ByteCode*,Lexeme*,unsigned_int,InplaceStr)
                                 ::token);
    if (iVar2 != 0) {
      ImportModule::token = NULLC::TraceGetToken("analyze","ImportModule");
      __cxa_guard_release(&ImportModule(ExpressionContext&,SynBase*,ByteCode*,Lexeme*,unsigned_int,InplaceStr)
                           ::token);
    }
  }
  NULLC::TraceScope::TraceScope(&local_278,ImportModule::token);
  if (bytecode == (ByteCode *)0x0) {
    __assert_fail("bytecode",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x33ac,
                  "void ImportModule(ExpressionContext &, SynBase *, ByteCode *, Lexeme *, unsigned int, InplaceStr)"
                 );
  }
  if (*name.end != '\0') {
    __assert_fail("*name.end == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x33ae,
                  "void ImportModule(ExpressionContext &, SynBase *, ByteCode *, Lexeme *, unsigned int, InplaceStr)"
                 );
  }
  pcVar3 = strstr(name.begin,".nc");
  if (pcVar3 == (char *)0x0) {
    __assert_fail("strstr(name.begin, \".nc\") != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x33af,
                  "void ImportModule(ExpressionContext &, SynBase *, ByteCode *, Lexeme *, unsigned int, InplaceStr)"
                 );
  }
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
  pMVar4 = (ModuleData *)CONCAT44(extraout_var,iVar2);
  pMVar4->source = source;
  (pMVar4->name).begin = name.begin;
  (pMVar4->name).end = name.end;
  pMVar4->importIndex = 0;
  pMVar4->bytecode = (ByteCode *)0x0;
  pMVar4->lexer = (Lexer *)0x0;
  pMVar4->lexStream = (Lexeme *)0x0;
  pMVar4->lexStreamSize = 0;
  pMVar4->startingFunctionIndex = 0;
  pMVar4->importedFunctionCount = 0;
  pMVar4->moduleFunctionCount = 0;
  uVar1 = (ctx->imports).count;
  if (uVar1 == (ctx->imports).max) {
    SmallArray<ModuleData_*,_128U>::grow(&ctx->imports,uVar1);
  }
  ppMVar5 = (ctx->imports).data;
  if (ppMVar5 != (ModuleData **)0x0) {
    uVar1 = (ctx->imports).count;
    uVar6 = uVar1 + 1;
    (ctx->imports).count = uVar6;
    ppMVar5[uVar1] = pMVar4;
    pMVar4->importIndex = uVar6;
    local_268 = (undefined1  [8])name.begin;
    pcStack_260 = name.end;
    ppMVar5 = SmallDenseMap<InplaceStr,_ModuleData_*,_InplaceStrHasher,_128U>::find
                        (&ctx->uniqueDependencyMap,(InplaceStr *)local_268);
    if (ppMVar5 == (ModuleData **)0x0) {
      uVar1 = (ctx->uniqueDependencies).count;
      if (uVar1 == (ctx->uniqueDependencies).max) {
        SmallArray<ModuleData_*,_128U>::grow(&ctx->uniqueDependencies,uVar1);
      }
      ppMVar5 = (ctx->uniqueDependencies).data;
      if (ppMVar5 == (ModuleData **)0x0) goto LAB_0020c254;
      uVar1 = (ctx->uniqueDependencies).count;
      (ctx->uniqueDependencies).count = uVar1 + 1;
      ppMVar5[uVar1] = pMVar4;
    }
    pMVar4->bytecode = bytecode;
    local_294 = lexStreamSize;
    if (lexStream == (Lexeme *)0x0) {
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x420);
      this = (Lexer *)CONCAT44(extraout_var_00,iVar2);
      Lexer::Lexer(this,ctx->allocator);
      pMVar4->lexer = this;
      pcVar3 = FindSource(bytecode);
      Lexer::Lexify(this,pcVar3);
      lexStream = Lexer::GetStreamStart(pMVar4->lexer);
      local_294 = Lexer::GetStreamSize(pMVar4->lexer);
      if (*name.end != '\0') {
        __assert_fail("!*name.end",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x33c3,
                      "void ImportModule(ExpressionContext &, SynBase *, ByteCode *, Lexeme *, unsigned int, InplaceStr)"
                     );
      }
      BinaryCache::PutLexemes(name.begin,lexStream,local_294);
    }
    pMVar4->lexStream = lexStream;
    pMVar4->lexStreamSize = local_294;
    pMVar4->startingFunctionIndex = (ctx->functions).count;
    local_158 = ctx->allocator;
    local_268 = (undefined1  [8])local_258;
    pcStack_260 = (char *)0x2000000000;
    local_150.data = local_150.little;
    local_150.count = 0;
    local_150.max = 0x20;
    local_150.allocator = local_158;
    local_38 = pMVar4;
    ImportModuleDependencies(ctx,source,(ModuleContext *)local_268,pMVar4->bytecode);
    ImportModuleNamespaces(ctx,source,(ModuleContext *)local_268);
    ImportModuleTypes(ctx,source,(ModuleContext *)local_268);
    ImportModuleVariables(ctx,source,(ModuleContext *)local_268);
    ImportModuleTypedefs(ctx,source,(ModuleContext *)local_268);
    ImportModuleFunctions(ctx,source,(ModuleContext *)local_268);
    pMVar4->moduleFunctionCount = (ctx->functions).count - pMVar4->startingFunctionIndex;
    SmallArray<TypeBase_*,_32U>::~SmallArray(&local_150);
    SmallArray<ModuleData_*,_32U>::~SmallArray((SmallArray<ModuleData_*,_32U> *)local_268);
    NULLC::TraceScope::~TraceScope(&local_278);
    return;
  }
LAB_0020c254:
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,
                "void SmallArray<ModuleData *, 128>::push_back(const T &) [T = ModuleData *, N = 128]"
               );
}

Assistant:

void ImportModule(ExpressionContext &ctx, SynBase *source, ByteCode* bytecode, Lexeme *lexStream, unsigned lexStreamSize, InplaceStr name)
{
	TRACE_SCOPE("analyze", "ImportModule");

	assert(bytecode);

	assert(*name.end == 0);
	assert(strstr(name.begin, ".nc") != 0);

	ModuleData *moduleData = new (ctx.get<ModuleData>()) ModuleData(source, name);

	ctx.imports.push_back(moduleData);
	moduleData->importIndex = ctx.imports.size();

	if(!ctx.uniqueDependencyMap.find(InplaceStr(name)))
		ctx.uniqueDependencies.push_back(moduleData);

	moduleData->bytecode = bytecode;

	if(!lexStream)
	{
		moduleData->lexer = new (ctx.get<Lexer>()) Lexer(ctx.allocator);

		moduleData->lexer->Lexify(FindSource(bytecode));
		lexStream = moduleData->lexer->GetStreamStart();
		lexStreamSize = moduleData->lexer->GetStreamSize();

		assert(!*name.end);

		BinaryCache::PutLexemes(name.begin, lexStream, lexStreamSize);
	}

	moduleData->lexStream = lexStream;
	moduleData->lexStreamSize = lexStreamSize;

	moduleData->startingFunctionIndex = ctx.functions.size();

	ModuleContext moduleCtx(ctx.allocator);

	moduleCtx.data = moduleData;

	ImportModuleDependencies(ctx, source, moduleCtx, moduleData->bytecode);

	ImportModuleNamespaces(ctx, source, moduleCtx);

	ImportModuleTypes(ctx, source, moduleCtx);

	ImportModuleVariables(ctx, source, moduleCtx);

	ImportModuleTypedefs(ctx, source, moduleCtx);

	ImportModuleFunctions(ctx, source, moduleCtx);

	moduleData->moduleFunctionCount = ctx.functions.size() - moduleData->startingFunctionIndex;
}